

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

void __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::increase
          (summary_impl<unsigned_int,_6UL> *this,data_t *arr,uint16_t pos)

{
  uint uVar1;
  int iVar2;
  atomic<unsigned_int> *paVar3;
  uint uVar4;
  int iVar5;
  undefined2 in_register_00000012;
  long lVar6;
  uint uVar7;
  ulong index;
  ulong index_00;
  
  paVar3 = data_t::operator[](arr,(ulong)CONCAT22(in_register_00000012,pos));
  LOCK();
  uVar4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  (paVar3->super___atomic_base<unsigned_int>)._M_i =
       (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (4290000000 < uVar4) {
    paVar3 = data_t::operator[](arr,(ulong)CONCAT22(in_register_00000012,pos));
    LOCK();
    (paVar3->super___atomic_base<unsigned_int>)._M_i =
         (paVar3->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    uVar7 = (uint)(pos >= 0x2000) * 0x2000;
    uVar4 = uVar7 + 0x2000;
    index_00 = (ulong)pos;
    iVar5 = uVar4 - pos;
    iVar2 = (uint)(pos < 0x2000) * 0x2000 + (uint)pos + -0x1fff;
    if (iVar5 <= iVar2) {
      iVar5 = iVar2;
    }
    lVar6 = 1;
    index = index_00;
    while( true ) {
      index = index - 1;
      index_00 = index_00 + 1;
      if (iVar5 <= lVar6) break;
      if (index_00 < uVar4) {
        paVar3 = data_t::operator[](arr,index_00);
        LOCK();
        uVar1 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        (paVar3->super___atomic_base<unsigned_int>)._M_i =
             (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
        if (uVar1 < 0xffb43481) {
          return;
        }
        paVar3 = data_t::operator[](arr,index_00);
        LOCK();
        (paVar3->super___atomic_base<unsigned_int>)._M_i =
             (paVar3->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
      }
      if ((long)(ulong)uVar7 <= (long)index) {
        paVar3 = data_t::operator[](arr,index);
        LOCK();
        uVar1 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        (paVar3->super___atomic_base<unsigned_int>)._M_i =
             (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
        if (uVar1 < 0xffb43481) {
          return;
        }
        paVar3 = data_t::operator[](arr,index);
        LOCK();
        (paVar3->super___atomic_base<unsigned_int>)._M_i =
             (paVar3->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
      }
      lVar6 = lVar6 + 1;
    }
  }
  return;
}

Assistant:

void increase(data_t& arr, uint16_t pos) {
    auto res = arr[pos].fetch_add(1, std::memory_order::relaxed);
    if constexpr (std::is_same_v<uint_type, uint32_t>) {
      if (res > near_uint32_max) /*no overflow*/ [[likely]] {
        arr[pos].fetch_sub(1, std::memory_order::relaxed);
        int upper = (pos < bucket_size / 2) ? (bucket_size / 2) : (bucket_size);
        int lower = (pos < bucket_size / 2) ? (0) : (bucket_size / 2);
        for (int delta = 1, lim = (std::max)(upper - pos, pos - lower + 1);
             delta < lim; ++delta) {
          if (pos + delta < upper) {
            if (arr[pos + delta].fetch_add(1, std::memory_order::relaxed) <=
                near_uint32_max) {
              break;
            }
            arr[pos + delta].fetch_sub(1, std::memory_order::relaxed);
          }
          if (pos - delta >= lower) {
            if (arr[pos - delta].fetch_add(1, std::memory_order::relaxed) <=
                near_uint32_max) {
              break;
            }
            arr[pos - delta].fetch_sub(1, std::memory_order::relaxed);
          }
        }
      }
    }
  }